

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_modelNotEqualByUnits_Test::~Equality_modelNotEqualByUnits_Test
          (Equality_modelNotEqualByUnits_Test *this)

{
  Equality_modelNotEqualByUnits_Test *this_local;
  
  ~Equality_modelNotEqualByUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, modelNotEqualByUnits)
{
    libcellml::ModelPtr m1 = libcellml::Model::create();
    libcellml::ModelPtr m2 = libcellml::Model::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsB");

    m1->addUnits(u1);
    m2->addUnits(u2);

    EXPECT_FALSE(m1->equals(m2));
    EXPECT_FALSE(m2->equals(m1));
}